

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O1

int Ver_ParseInitial(Ver_Man_t *pMan,Abc_Ntk_t *pNtk)

{
  Ver_Stream_t *p;
  long *plVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  char *__s1;
  Abc_Obj_t *pObj;
  char *pcVar6;
  undefined8 uVar7;
  
  p = pMan->pReader;
  __s1 = Ver_ParseGetName(pMan);
  iVar4 = 0;
  if (__s1 != (char *)0x0) {
    iVar4 = strcmp(__s1,"begin");
    do {
      if (iVar4 == 0) {
        __s1 = Ver_ParseGetName(pMan);
        if (__s1 == (char *)0x0) {
          return 0;
        }
        iVar5 = strcmp(__s1,"end");
        if (iVar5 == 0) break;
      }
      pObj = Ver_ParseFindNet(pNtk,__s1);
      if (pObj == (Abc_Obj_t *)0x0) {
        pcVar6 = "Cannot read the initial statement for %s (output wire is not defined).";
LAB_00351922:
        sprintf(pMan->sError,pcVar6,__s1);
LAB_00351957:
        Ver_ParsePrintErrorMessage(pMan);
        return 0;
      }
      cVar3 = Ver_StreamPopChar(p);
      if ((byte)(cVar3 - 0x3eU) < 0xfe) {
        pcVar6 = "Cannot read the assign statement for %s (expected <= or =).";
        goto LAB_00351922;
      }
      if (cVar3 == '<') {
        Ver_StreamPopChar(p);
      }
      iVar5 = Ver_ParseSkipComments(pMan);
      if (iVar5 == 0) {
        return 0;
      }
      pcVar6 = Ver_StreamGetWord(p,";");
      if (pcVar6 == (char *)0x0) {
        return 0;
      }
      if ((pObj->vFanins).nSize == 0) {
        builtin_strncpy(pMan->sError,"Cannot find the latch to assign the initial value.",0x33);
        goto LAB_00351957;
      }
      plVar1 = (long *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
      lVar2 = *(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8);
      if ((*(uint *)(lVar2 + 0x14) & 0xf) != 8) {
        __assert_fail("Abc_ObjIsLatch(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                      ,0x41c,"int Ver_ParseInitial(Ver_Man_t *, Abc_Ntk_t *)");
      }
      iVar5 = strcmp(pcVar6,"0");
      if ((iVar5 == 0) || (iVar5 = strcmp(pcVar6,"1\'b0"), iVar5 == 0)) {
        uVar7 = 1;
      }
      else {
        iVar5 = strcmp(pcVar6,"1");
        if ((iVar5 != 0) && (iVar5 = strcmp(pcVar6,"1\'b1"), iVar5 != 0)) {
          __s1 = Abc_ObjName(pObj);
          pcVar6 = "Incorrect initial value of the latch %s.";
          goto LAB_00351922;
        }
        uVar7 = 2;
      }
      *(undefined8 *)(lVar2 + 0x38) = uVar7;
      cVar3 = Ver_StreamPopChar(p);
      if (cVar3 != ';') {
        __assert_fail("Symbol == \';\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                      ,0x42c,"int Ver_ParseInitial(Ver_Man_t *, Abc_Ntk_t *)");
      }
    } while (iVar4 == 0);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int Ver_ParseInitial( Ver_Man_t * pMan, Abc_Ntk_t * pNtk )
{
    Ver_Stream_t * p = pMan->pReader;
    Abc_Obj_t * pNode, * pNet;
    int fStopAfterOne;
    char * pWord, * pEquation;
    char Symbol;
    // parse the directive 
    pWord = Ver_ParseGetName( pMan );
    if ( pWord == NULL )
        return 0;
    // decide how many statements to parse
    fStopAfterOne = 0;
    if ( strcmp( pWord, "begin" ) )
        fStopAfterOne = 1;
    // iterate over the initial states
    while ( 1 )
    {
        if ( !fStopAfterOne )
        {
            // get the name of the output signal
            pWord = Ver_ParseGetName( pMan );
            if ( pWord == NULL )
                return 0;
            // look for the end of directive
            if ( !strcmp( pWord, "end" ) )
                break;
        }
        // get the fanout net
        pNet = Ver_ParseFindNet( pNtk, pWord );
        if ( pNet == NULL )
        {
            sprintf( pMan->sError, "Cannot read the initial statement for %s (output wire is not defined).", pWord );
            Ver_ParsePrintErrorMessage( pMan );
            return 0;
        }
        // get the equality sign
        Symbol = Ver_StreamPopChar(p);
        if ( Symbol != '<' && Symbol != '=' )
        {
            sprintf( pMan->sError, "Cannot read the assign statement for %s (expected <= or =).", pWord );
            Ver_ParsePrintErrorMessage( pMan );
            return 0;
        }
        if ( Symbol == '<' )
            Ver_StreamPopChar(p);
        // skip the comments
        if ( !Ver_ParseSkipComments( pMan ) )
            return 0;
        // get the second name
        pEquation = Ver_StreamGetWord( p, ";" );
        if ( pEquation == NULL )
            return 0;
        // find the corresponding latch
        if ( Abc_ObjFaninNum(pNet) == 0 )
        {
            sprintf( pMan->sError, "Cannot find the latch to assign the initial value." );
            Ver_ParsePrintErrorMessage( pMan );
            return 0;
        }
        pNode = Abc_ObjFanin0(Abc_ObjFanin0(pNet));
        assert( Abc_ObjIsLatch(pNode) );
        // set the initial state
        if ( !strcmp(pEquation, "0") || !strcmp(pEquation, "1\'b0") )
            Abc_LatchSetInit0( pNode );
        else if ( !strcmp(pEquation, "1") || !strcmp(pEquation, "1\'b1") )
            Abc_LatchSetInit1( pNode );
//        else if ( !strcmp(pEquation, "2") )
//            Abc_LatchSetInitDc( pNode );
        else 
        {
            sprintf( pMan->sError, "Incorrect initial value of the latch %s.", Abc_ObjName(pNet) );
            Ver_ParsePrintErrorMessage( pMan );
            return 0;
        }
        // remove the last symbol
        Symbol = Ver_StreamPopChar(p);
        assert( Symbol == ';' );
        // quit if only one directive
        if ( fStopAfterOne )
            break;
    }
    return 1;
}